

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::computeQuadTexCoordCube
               (vector<float,_std::allocator<float>_> *dst,CubeFace face)

{
  int iVar1;
  pointer pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (face < CUBEFACE_LAST) {
    iVar1 = *(int *)(&DAT_00a1e500 + (ulong)face * 4);
    std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
    pfVar2 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = *(undefined8 *)(&DAT_00a1e500 + iVar1);
    uVar4 = *(undefined8 *)(&UNK_00a1e508 + iVar1);
    uVar5 = *(undefined8 *)(&DAT_00a1e510 + iVar1);
    uVar6 = *(undefined8 *)(&DAT_00a1e518 + iVar1);
    uVar7 = *(undefined8 *)(&UNK_00a1e528 + iVar1);
    *(undefined8 *)(pfVar2 + 8) = *(undefined8 *)(&DAT_00a1e520 + iVar1);
    *(undefined8 *)(pfVar2 + 10) = uVar7;
    *(undefined8 *)(pfVar2 + 4) = uVar5;
    *(undefined8 *)(pfVar2 + 6) = uVar6;
    *(undefined8 *)pfVar2 = uVar3;
    *(undefined8 *)(pfVar2 + 2) = uVar4;
  }
  return;
}

Assistant:

void computeQuadTexCoordCube (std::vector<float>& dst, tcu::CubeFace face)
{
	static const float texCoordNegX[] =
	{
		-1.0f,  1.0f, -1.0f,
		-1.0f, -1.0f, -1.0f,
		-1.0f,  1.0f,  1.0f,
		-1.0f, -1.0f,  1.0f
	};
	static const float texCoordPosX[] =
	{
		+1.0f,  1.0f,  1.0f,
		+1.0f, -1.0f,  1.0f,
		+1.0f,  1.0f, -1.0f,
		+1.0f, -1.0f, -1.0f
	};
	static const float texCoordNegY[] =
	{
		-1.0f, -1.0f,  1.0f,
		-1.0f, -1.0f, -1.0f,
		 1.0f, -1.0f,  1.0f,
		 1.0f, -1.0f, -1.0f
	};
	static const float texCoordPosY[] =
	{
		-1.0f, +1.0f, -1.0f,
		-1.0f, +1.0f,  1.0f,
		 1.0f, +1.0f, -1.0f,
		 1.0f, +1.0f,  1.0f
	};
	static const float texCoordNegZ[] =
	{
		 1.0f,  1.0f, -1.0f,
		 1.0f, -1.0f, -1.0f,
		-1.0f,  1.0f, -1.0f,
		-1.0f, -1.0f, -1.0f
	};
	static const float texCoordPosZ[] =
	{
		-1.0f,  1.0f, +1.0f,
		-1.0f, -1.0f, +1.0f,
		 1.0f,  1.0f, +1.0f,
		 1.0f, -1.0f, +1.0f
	};

	const float*	texCoord		= DE_NULL;
	int				texCoordSize	= DE_LENGTH_OF_ARRAY(texCoordNegX);

	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: texCoord = texCoordNegX; break;
		case tcu::CUBEFACE_POSITIVE_X: texCoord = texCoordPosX; break;
		case tcu::CUBEFACE_NEGATIVE_Y: texCoord = texCoordNegY; break;
		case tcu::CUBEFACE_POSITIVE_Y: texCoord = texCoordPosY; break;
		case tcu::CUBEFACE_NEGATIVE_Z: texCoord = texCoordNegZ; break;
		case tcu::CUBEFACE_POSITIVE_Z: texCoord = texCoordPosZ; break;
		default:
			DE_ASSERT(DE_FALSE);
			return;
	}

	dst.resize(texCoordSize);
	std::copy(texCoord, texCoord+texCoordSize, dst.begin());
}